

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall SQCompilation::CodegenVisitor::visitArrayExpr(CodegenVisitor *this,ArrayExpr *expr)

{
  Node *this_00;
  size_type_conflict sVar1;
  int iVar2;
  ArenaVector<SQCompilation::Expr_*> *this_01;
  SQInteger arg0;
  Expr **ppEVar3;
  SQFuncState *this_02;
  SQInteger SVar4;
  ArrayExpr *in_RSI;
  SQFuncState *in_RDI;
  SQInteger array;
  SQInteger val;
  Expr *valExpr;
  SQUnsignedInteger i;
  ArenaVector<SQCompilation::Expr_*> *inits;
  SQInteger in_stack_ffffffffffffffa0;
  undefined2 uVar5;
  SQFuncState *in_stack_ffffffffffffffa8;
  Node *n;
  SQFuncState *arg1;
  undefined8 in_stack_ffffffffffffffc8;
  SQOpcode _op;
  SQFuncState *in_stack_ffffffffffffffd0;
  Node *local_20;
  
  _op = (SQOpcode)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  maybeAddInExprLine((CodegenVisitor *)in_RDI,(Expr *)in_stack_ffffffffffffffa8);
  this_01 = ArrayExpr::initializers(in_RSI);
  arg1 = (SQFuncState *)in_RDI->_returnexp;
  arg0 = SQFuncState::PushTarget(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ArenaVector<SQCompilation::Expr_*>::size(this_01);
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffffd0,_op,arg0,(SQInteger)arg1,(SQInteger)in_RDI,
             (SQInteger)in_stack_ffffffffffffffa8);
  local_20 = (Node *)0x0;
  while( true ) {
    n = local_20;
    sVar1 = ArenaVector<SQCompilation::Expr_*>::size(this_01);
    if ((Node *)(ulong)sVar1 <= n) break;
    ppEVar3 = ArenaVector<SQCompilation::Expr_*>::operator[](this_01,(size_type_conflict)local_20);
    this_00 = &(*ppEVar3)->super_Node;
    if (local_20 < (Node *)0x64) {
      iVar2 = Node::lineStart(this_00);
      if (iVar2 != -1) {
        uVar5 = (undefined2)((ulong)in_RDI->_returnexp >> 0x30);
        Node::lineStart(this_00);
        SQFuncState::AddLineInfos(in_RDI,(SQInteger)n,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
      }
    }
    visitForceGet((CodegenVisitor *)in_RDI,n);
    this_02 = (SQFuncState *)SQFuncState::PopTarget(in_RDI);
    SVar4 = SQFuncState::TopTarget((SQFuncState *)0x1c79af);
    SQFuncState::AddInstruction
              (this_02,(SQOpcode)((ulong)SVar4 >> 0x20),arg0,(SQInteger)arg1,(SQInteger)in_RDI,
               (SQInteger)n);
    local_20 = (Node *)((long)&(local_20->super_ArenaObj)._vptr_ArenaObj + 1);
  }
  return;
}

Assistant:

void CodegenVisitor::visitArrayExpr(ArrayExpr *expr) {
    maybeAddInExprLine(expr);
    const auto &inits = expr->initializers();

    _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), inits.size(), 0, NOT_ARRAY);

    for (SQUnsignedInteger i = 0; i < inits.size(); ++i) {
        Expr *valExpr = inits[i];
#if SQ_LINE_INFO_IN_STRUCTURES
        if (i < 100 && valExpr->lineStart() != -1)
            _fs->AddLineInfos(valExpr->lineStart(), false, false);
#endif
        visitForceGet(valExpr);
        SQInteger val = _fs->PopTarget();
        SQInteger array = _fs->TopTarget();
        _fs->AddInstruction(_OP_APPENDARRAY, array, val, AAT_STACK);
    }
}